

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

int Gia_ManFindTwoUnate(word **pSets,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t **vUnateLits,
                       Vec_Int_t **vUnateLitsW,int fVerbose)

{
  uint uVar1;
  char *pOff;
  ulong uVar2;
  int nPairs;
  uint local_44;
  Vec_Int_t **local_40;
  Vec_Int_t **local_38;
  
  pOff = (char *)pSets;
  local_40 = vUnateLits;
  local_38 = vUnateLitsW;
  if (fVerbose != 0) {
    pOff = "  ";
    printf("  ");
  }
  uVar2 = 0;
  while( true ) {
    uVar1 = Gia_ManFindTwoUnateInt
                      ((word *)pOff,pSets[uVar2 ^ 1],vDivs,nWords,local_40[uVar2],local_38[uVar2],
                       (int *)&local_44);
    if (fVerbose != 0) {
      pOff = "UU%d =%5d ";
      printf("UU%d =%5d ",uVar2 & 0xffffffff,(ulong)local_44);
    }
    if (-1 < (int)uVar1) break;
    uVar2 = uVar2 + 1;
    if (uVar2 != 1) {
      return -1;
    }
  }
  return uVar1 ^ uVar2 == 1;
}

Assistant:

int Gia_ManFindTwoUnate( word * pSets[2], Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnateLits[2], Vec_Int_t * vUnateLitsW[2], int fVerbose )
{
    int n, iLit, nPairs;
    if ( fVerbose ) printf( "  " );
    for ( n = 0; n < 2; n++ )
    {
        //int nPairsAll = Vec_IntSize(vUnateLits[n])*(Vec_IntSize(vUnateLits[n])-1)/2;
        iLit = Gia_ManFindTwoUnateInt( pSets[n], pSets[!n], vDivs, nWords, vUnateLits[n], vUnateLitsW[n], &nPairs );
        if ( fVerbose ) printf( "UU%d =%5d ", n, nPairs );
        if ( iLit >= 0 )
            return Abc_LitNotCond(iLit, n);
    }
    return -1;
}